

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitiveSetInvarianceCase::iterate
          (PrimitiveSetInvarianceCase *this)

{
  pointer pLVar1;
  float *pfVar2;
  float fVar3;
  TestLog *pTVar4;
  RenderContext *pRVar5;
  iterator __position;
  _anonymous_namespace_ *this_00;
  bool bVar6;
  pointer pVVar7;
  int iVar8;
  deUint32 dVar9;
  int iVar10;
  undefined4 extraout_var;
  long lVar11;
  long *plVar12;
  pointer pPVar13;
  uint uVar14;
  char *pcVar15;
  TestLog *pTVar16;
  long lVar17;
  long lVar18;
  pointer pTVar19;
  VertexArrayBinding *in_R9;
  long lVar20;
  pointer pTVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  tessLevelCases;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> prim0Vertices;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> firstPrimVertices;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  primitiveCounts;
  Result tfResult;
  RandomViewport viewport;
  float attribute [14];
  int primCount;
  string tessLevelsStr;
  TFHandler transformFeedback;
  deUint32 local_694;
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  local_670;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_658;
  float *local_640;
  pointer local_638;
  long local_630;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_628;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_608;
  Result local_5e8;
  RandomViewport local_5c8;
  string local_5b8;
  float local_598;
  float local_594;
  float local_590;
  float local_58c;
  float local_588;
  float local_584;
  undefined4 local_580;
  float local_57c;
  float local_578;
  float local_574;
  float local_570;
  float local_56c;
  float local_568;
  undefined4 local_564;
  long local_560;
  undefined1 local_558 [8];
  _Alloc_hider local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  int local_530;
  VertexArrayPointer local_528;
  undefined1 local_508 [8];
  undefined1 auStack_500 [8];
  TestLog local_4f8;
  _func_int *ap_Stack_4f0 [2];
  int local_4e0;
  ios_base local_490 [272];
  undefined1 local_380 [8];
  undefined1 local_378 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370 [6];
  ios_base local_308 [264];
  TransformFeedbackHandler<tcu::Vector<float,_3>_> local_200;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  undefined4 extraout_var_00;
  
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar8 = (*pRVar5->_vptr_RenderContext[4])(pRVar5);
  dVar9 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_5c8,(RenderTarget *)CONCAT44(extraout_var,iVar8),0x10,0x10,dVar9);
  iVar8 = (*pRVar5->_vptr_RenderContext[3])(pRVar5);
  lVar11 = CONCAT44(extraout_var_00,iVar8);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&local_670,this);
  local_608.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_608.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_608.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)((ulong)((long)local_670.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_670.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
    iVar8 = -2;
  }
  else {
    iVar8 = -1;
    lVar18 = 0;
    do {
      local_508 = (undefined1  [8])0x0;
      auStack_500 = (undefined1  [8])0x0;
      local_4f8.m_log = (qpTestLog *)0x0;
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&local_608,(vector<int,_std::allocator<int>_> *)local_508);
      if (local_508 != (undefined1  [8])0x0) {
        operator_delete((void *)local_508,(long)local_4f8.m_log - (long)local_508);
      }
      pTVar19 = local_670.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18].levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)local_670.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar18].levels.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar19) >> 3)
              * -0x55555555) {
        lVar20 = 8;
        lVar22 = 0;
        do {
          iVar10 = referencePrimitiveCount
                             (this->m_primitiveType,this->m_spacing,this->m_usePointMode,
                              (float *)((long)pTVar19->inner + lVar20 + -8),
                              (float *)((long)pTVar19->inner + lVar20));
          local_508._0_4_ = iVar10;
          __position._M_current =
               local_608.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (__position._M_current ==
              local_608.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)
                       (local_608.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),__position,(int *)local_508
                      );
          }
          else {
            *__position._M_current = iVar10;
            local_608.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
                 = __position._M_current + 1;
          }
          iVar10 = local_508._0_4_;
          if ((int)local_508._0_4_ < iVar8) {
            iVar10 = iVar8;
          }
          iVar8 = iVar10;
          lVar22 = lVar22 + 1;
          pTVar19 = local_670.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar18].levels.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = lVar20 + 0x18;
        } while (lVar22 < (int)((ulong)((long)local_670.
                                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                                              ._M_impl.super__Vector_impl_data._M_start[lVar18].
                                              levels.
                                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pTVar19) >> 3) * -0x55555555);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (int)((ulong)((long)local_670.
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_670.
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5));
    iVar8 = iVar8 * 2;
  }
  if (this->m_usePointMode == true) {
    iVar10 = 1;
    local_694 = 0;
  }
  else if (this->m_primitiveType < TESSPRIMITIVETYPE_ISOLINES) {
    iVar10 = 3;
    local_694 = 4;
  }
  else if (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
    iVar10 = 2;
    local_694 = 1;
  }
  else {
    local_694 = 0xffffffff;
    iVar10 = -1;
  }
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&local_200,((this->super_TestCase).m_context)->m_renderCtx,iVar8 * iVar10);
  (**(code **)(lVar11 + 0x1a00))(local_5c8.x,local_5c8.y,local_5c8.width,local_5c8.height);
  (**(code **)(lVar11 + 0xfd8))(0x8e72);
  if (0 < (int)((ulong)((long)local_670.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_670.
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
    lVar18 = 0;
    do {
      local_560 = lVar18 * 0x20;
      pLVar1 = local_670.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar18;
      local_628.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_628.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_628.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_380 = (undefined1  [8])(local_378 + 8);
      local_378 = (undefined1  [8])0x0;
      local_370[0]._M_local_buf[0] = '\0';
      pTVar19 = local_670.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18].levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar21 = local_670.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18].levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_630 = lVar18;
      if (0 < (int)((ulong)((long)pTVar21 - (long)pTVar19) >> 3) * -0x55555555) {
        lVar18 = 0;
        lVar20 = 0;
        do {
          Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                    ((string *)local_1b0,(_anonymous_namespace_ *)((long)pTVar19->inner + lVar18),
                     (float *)0x2,(int)lVar18 + (int)pTVar19 + 8,(float *)&DAT_00000004,(int)in_R9);
          pcVar15 = "";
          if (1 < (ulong)(((long)pTVar21 - (long)pTVar19 >> 3) * -0x5555555555555555)) {
            pcVar15 = "\n";
          }
          plVar12 = (long *)std::__cxx11::string::replace
                                      ((ulong)local_1b0,0,(char *)0x0,(ulong)pcVar15);
          pTVar16 = (TestLog *)(plVar12 + 2);
          if ((TestLog *)*plVar12 == pTVar16) {
            local_4f8.m_log = pTVar16->m_log;
            ap_Stack_4f0[0] = (_func_int *)plVar12[3];
            local_508 = (undefined1  [8])(auStack_500 + 8);
          }
          else {
            local_4f8.m_log = pTVar16->m_log;
            local_508 = (undefined1  [8])*plVar12;
          }
          auStack_500 = (undefined1  [8])plVar12[1];
          *plVar12 = (long)pTVar16;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append(local_380,(ulong)local_508);
          if (local_508 != (undefined1  [8])(auStack_500 + 8)) {
            operator_delete((void *)local_508,(ulong)((long)&(local_4f8.m_log)->flags + 1));
          }
          if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
            operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
          }
          lVar20 = lVar20 + 1;
          pTVar19 = (pLVar1->levels).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar21 = (pLVar1->levels).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          lVar18 = lVar18 + 0x18;
        } while (lVar20 < (int)((ulong)((long)pTVar21 - (long)pTVar19) >> 3) * -0x55555555);
      }
      local_508 = (undefined1  [8])pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_500);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_500,"Tessellation level sets: ",0x19);
      lVar18 = local_630;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_500,(char *)local_380,(long)local_378);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_508,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_500);
      std::ios_base::~ios_base(local_490);
      if (local_380 != (undefined1  [8])(local_378 + 8)) {
        operator_delete((void *)local_380,
                        CONCAT71(local_370[0]._M_allocated_capacity._1_7_,
                                 local_370[0]._M_local_buf[0]) + 1);
      }
      pTVar19 = (pLVar1->levels).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(pLVar1->levels).
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar19) >> 3)
              * -0x55555555) {
        lVar20 = 0;
        do {
          local_598 = pTVar19[lVar20].inner[0];
          local_594 = pTVar19[lVar20].inner[1];
          local_590 = pTVar19[lVar20].outer[0];
          local_58c = pTVar19[lVar20].outer[1];
          local_588 = pTVar19[lVar20].outer[2];
          local_584 = pTVar19[lVar20].outer[3];
          local_580 = 0;
          local_57c = pTVar19[lVar20].inner[0];
          local_578 = pTVar19[lVar20].inner[1];
          local_574 = pTVar19[lVar20].outer[0];
          local_570 = pTVar19[lVar20].outer[1];
          local_56c = pTVar19[lVar20].outer[2];
          local_568 = pTVar19[lVar20].outer[3];
          local_564 = 0x3f000000;
          local_380 = (undefined1  [8])(local_378 + 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"in_v_attr","");
          local_508._0_4_ = 1;
          auStack_500 = (undefined1  [8])ap_Stack_4f0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)auStack_500,local_380,(pointer)((long)local_378 + (long)local_380));
          local_4e0 = 0;
          local_558._0_4_ = local_508._0_4_;
          local_550._M_p = (pointer)&local_540;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_550,auStack_500,
                     (long)&(local_4f8.m_log)->flags + (long)auStack_500);
          local_530 = local_4e0;
          local_528.componentType = VTX_COMP_FLOAT;
          local_528.convert = VTX_COMP_CONVERT_NONE;
          local_528.numComponents = 1;
          local_528.numElements = 0xe;
          local_528.stride = 0;
          local_528.data = &local_598;
          if (auStack_500 != (undefined1  [8])ap_Stack_4f0) {
            operator_delete((void *)auStack_500,(ulong)(ap_Stack_4f0[0] + 1));
          }
          if (local_380 != (undefined1  [8])(local_378 + 8)) {
            operator_delete((void *)local_380,
                            CONCAT71(local_370[0]._M_allocated_capacity._1_7_,
                                     local_370[0]._M_local_buf[0]) + 1);
          }
          pPVar13 = (this->m_programs).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((int)((ulong)((long)(this->m_programs).
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar13) >> 3)
              * -0x55555555 < 1) {
            iVar8 = 0x11;
            bVar6 = false;
          }
          else {
            local_638 = pTVar19 + lVar20;
            local_640 = pTVar19[lVar20].outer;
            lVar22 = 0;
            do {
              dVar9 = ((pPVar13[lVar22].program.m_ptr)->m_program).m_program;
              (**(code **)(lVar11 + 0x1680))(dVar9);
              in_R9 = (VertexArrayBinding *)local_558;
              TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                        (&local_5e8,&local_200,dVar9,local_694,1,in_R9,0xe);
              if (local_5e8.numPrimitives ==
                  local_608.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar18].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar20] * 2) {
                lVar18 = (long)(((int)((ulong)((long)local_5e8.varying.
                                                                                                          
                                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_5e8.varying.
                                                                                                        
                                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                -0x55555555) / 2);
                std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
                vector<__gnu_cxx::__normal_iterator<tcu::Vector<float,3>const*,std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>,void>
                          ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)
                           &local_658,
                           (__normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                            )local_5e8.varying.
                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           local_5e8.varying.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar18,
                           (allocator_type *)local_508);
                pVVar7 = local_5e8.varying.
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar14 = (int)((long)local_658.
                                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_658.
                                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x55555555;
                if (0 < (int)uVar14) {
                  lVar17 = 8;
                  lVar23 = 0;
                  uVar24 = 0;
                  do {
                    fVar3 = *(float *)((long)(local_658.
                                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                      lVar17 + -8);
                    pfVar2 = (float *)((long)local_5e8.varying.
                                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar18].
                                             m_data + lVar17 + -8);
                    if ((((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) ||
                        (fVar3 = *(float *)((long)(local_658.
                                                                                                      
                                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->m_data
                                           + lVar17 + -4),
                        pfVar2 = (float *)((long)local_5e8.varying.
                                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar18].
                                                 m_data + lVar17 + -4), fVar3 != *pfVar2)) ||
                       (((NAN(fVar3) || NAN(*pfVar2) ||
                         (fVar3 = *(float *)((long)(local_658.
                                                                                                        
                                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->m_data
                                            + lVar17),
                         pfVar2 = (float *)((long)local_5e8.varying.
                                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar18].
                                                  m_data + lVar17), fVar3 != *pfVar2)) ||
                        (NAN(fVar3) || NAN(*pfVar2))))) {
                      local_1b0 = (undefined1  [8])pTVar4;
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"Failure: tessellation coordinate at index ",
                                 0x2a);
                      std::ostream::operator<<(local_1a8,(int)uVar24);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 " differs between two primitives drawn in one draw call",0x36);
                      local_380 = (undefined1  [8])
                                  tcu::MessageBuilder::operator<<
                                            ((MessageBuilder *)local_1b0,
                                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_378,"Note: the coordinate is ",0x18);
                      tcu::operator<<((ostream *)local_378,
                                      (Vector<float,_3> *)
                                      ((long)local_658.
                                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start - lVar23));
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_378," for the first primitive and ",0x1d);
                      tcu::operator<<((ostream *)local_378,
                                      (Vector<float,_3> *)((long)pVVar7 + (lVar18 * 0xc - lVar23)));
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_378," for the second",0xf);
                      local_508 = (undefined1  [8])
                                  tcu::MessageBuilder::operator<<
                                            ((MessageBuilder *)local_380,
                                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_500);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)auStack_500,
                                 "Note: tessellation levels for both primitives were: ",0x34);
                      Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                                (&local_5b8,(_anonymous_namespace_ *)local_638,(float *)0x2,
                                 (int)local_640,(float *)&DAT_00000004,(int)in_R9);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)auStack_500,local_5b8._M_dataplus._M_p,
                                 local_5b8._M_string_length);
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_508,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                        operator_delete(local_5b8._M_dataplus._M_p,
                                        local_5b8.field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_500);
                      std::ios_base::~ios_base(local_490);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
                      std::ios_base::~ios_base(local_308);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                      std::ios_base::~ios_base(local_138);
                      tcu::TestContext::setTestResult
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                                 QP_TEST_RESULT_FAIL,"Invalid set of primitives");
                      bVar6 = false;
                      goto LAB_01420050;
                    }
                    uVar24 = uVar24 + 1;
                    lVar23 = lVar23 + -0xc;
                    lVar17 = lVar17 + 0xc;
                  } while ((uVar14 & 0x7fffffff) != uVar24);
                }
                if ((int)lVar20 == 0 && (int)lVar22 == 0) {
                  bVar6 = true;
                  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                  operator=(&local_628,&local_658);
                }
                else {
                  iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                                    (this,&local_628,&local_658,(ulong)(uint)pLVar1->mem);
                  bVar6 = true;
                  if ((char)iVar8 == '\0') {
                    local_508 = (undefined1  [8])pTVar4;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_500);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_500,
                               "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
                               ,0x62);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_500,"  - case A: program 0, tessellation levels: "
                               ,0x2c);
                    this_00 = *(_anonymous_namespace_ **)
                               ((long)&((local_670.
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->levels).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                                       ._M_impl.super__Vector_impl_data._M_start + local_560);
                    Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                              ((string *)local_380,this_00,(float *)0x2,(int)this_00 + 8,
                               (float *)&DAT_00000004,(int)in_R9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_500,(char *)local_380,(long)local_378);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_500,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_500,"  - case B: program ",0x14);
                    std::ostream::operator<<((ostringstream *)auStack_500,(int)lVar22);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_500,", tessellation levels: ",0x17);
                    Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                              ((string *)local_1b0,(_anonymous_namespace_ *)local_638,(float *)0x2,
                               (int)local_640,(float *)&DAT_00000004,(int)in_R9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_500,(char *)local_1b0,(long)local_1a8);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_508,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
                      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
                    }
                    if (local_380 != (undefined1  [8])(local_378 + 8)) {
                      operator_delete((void *)local_380,
                                      CONCAT71(local_370[0]._M_allocated_capacity._1_7_,
                                               local_370[0]._M_local_buf[0]) + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_500);
                    std::ios_base::~ios_base(local_490);
                    tcu::TestContext::setTestResult
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                               QP_TEST_RESULT_FAIL,"Invalid set of primitives");
                    bVar6 = false;
                  }
                }
LAB_01420050:
                lVar18 = local_630;
                if (local_658.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_658.
                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_658.
                                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_658.
                                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                  lVar18 = local_630;
                }
              }
              else {
                local_508 = (undefined1  [8])pTVar4;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_500);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_500,
                           "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be ",
                           0x44);
                std::ostream::operator<<((ostringstream *)auStack_500,local_5e8.numPrimitives);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_500,", reference value is ",0x15);
                std::ostream::operator<<
                          ((ostringstream *)auStack_500,
                           local_608.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar18].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar20] * 2);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_508,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_500);
                std::ios_base::~ios_base(local_490);
                tcu::TestContext::setTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                           QP_TEST_RESULT_FAIL,"Invalid set of primitives");
                bVar6 = false;
              }
              if (local_5e8.varying.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (Vector<float,_3> *)0x0) {
                operator_delete(local_5e8.varying.
                                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_5e8.varying.
                                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_5e8.varying.
                                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (!bVar6) {
                iVar8 = 1;
                goto LAB_014200d1;
              }
              lVar22 = lVar22 + 1;
              pPVar13 = (this->m_programs).
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (lVar22 < (int)((ulong)((long)(this->m_programs).
                                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pPVar13) >> 3) * -0x55555555);
            iVar8 = 0x11;
LAB_014200d1:
            bVar6 = (bool)(bVar6 ^ 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_550._M_p != &local_540) {
            operator_delete(local_550._M_p,local_540._M_allocated_capacity + 1);
          }
          if (bVar6) goto LAB_01420136;
          lVar20 = lVar20 + 1;
          pTVar19 = (pLVar1->levels).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (lVar20 < (int)((ulong)((long)(pLVar1->levels).
                                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pTVar19) >> 3) * -0x55555555);
      }
      iVar8 = 0;
LAB_01420136:
      if (local_628.
          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_628.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_628.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_628.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (iVar8 != 0) {
        if (iVar8 != 8) goto LAB_01420192;
        break;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (int)((ulong)((long)local_670.
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_670.
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5));
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
LAB_01420192:
  glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tfPrimQuery.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tfBuffer.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tf.super_ObjectWrapper);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_608);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  ::~vector(&local_670);
  return STOP;
}

Assistant:

PrimitiveSetInvarianceCase::IterateResult PrimitiveSetInvarianceCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&					log					= m_testCtx.getLog();
	const RenderContext&		renderCtx			= m_context.getRenderContext();
	const RandomViewport		viewport			(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&		gl					= renderCtx.getFunctions();
	const vector<LevelCase>		tessLevelCases		= genTessLevelCases();
	vector<vector<int> >		primitiveCounts;
	int							maxNumPrimitives	= -1;

	for (int caseNdx = 0; caseNdx < (int)tessLevelCases.size(); caseNdx++)
	{
		primitiveCounts.push_back(vector<int>());
		for (int i = 0; i < (int)tessLevelCases[caseNdx].levels.size(); i++)
		{
			const int primCount = referencePrimitiveCount(m_primitiveType, m_spacing, m_usePointMode,
														  &tessLevelCases[caseNdx].levels[i].inner[0], &tessLevelCases[caseNdx].levels[i].outer[0]);
			primitiveCounts.back().push_back(primCount);
			maxNumPrimitives = de::max(maxNumPrimitives, primCount);
		}
	}

	const deUint32				primitiveTypeGL		= outputPrimitiveTypeGL(m_primitiveType, m_usePointMode);
	const TFHandler				transformFeedback	(m_context.getRenderContext(), 2*maxNumPrimitives*numVerticesPerPrimitive(primitiveTypeGL));

	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 7);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < (int)tessLevelCases.size(); tessLevelCaseNdx++)
	{
		const LevelCase&	levelCase = tessLevelCases[tessLevelCaseNdx];
		vector<Vec3>		firstPrimVertices;

		{
			string tessLevelsStr;
			for (int i = 0; i < (int)levelCase.levels.size(); i++)
				tessLevelsStr += (levelCase.levels.size() > 1 ? "\n" : "") + levelCase.levels[i].description();
			log << TestLog::Message << "Tessellation level sets: " << tessLevelsStr << TestLog::EndMessage;
		}

		for (int subTessLevelCaseNdx = 0; subTessLevelCaseNdx < (int)levelCase.levels.size(); subTessLevelCaseNdx++)
		{
			const TessLevels&				tessLevels		= levelCase.levels[subTessLevelCaseNdx];
			const float						(&inner)[2]		= tessLevels.inner;
			const float						(&outer)[4]		= tessLevels.outer;
			const float						attribute[2*7]	= { inner[0], inner[1], outer[0], outer[1], outer[2], outer[3], 0.0f,
																inner[0], inner[1], outer[0], outer[1], outer[2], outer[3], 0.5f };
			const glu::VertexArrayBinding	bindings[]		= { glu::va::Float("in_v_attr", 1, DE_LENGTH_OF_ARRAY(attribute), 0, &attribute[0]) };

			for (int programNdx = 0; programNdx < (int)m_programs.size(); programNdx++)
			{
				const deUint32				programGL	= m_programs[programNdx].program->getProgram();
				gl.useProgram(programGL);
				const TFHandler::Result		tfResult	= transformFeedback.renderAndGetPrimitives(programGL, primitiveTypeGL, DE_LENGTH_OF_ARRAY(bindings), &bindings[0], DE_LENGTH_OF_ARRAY(attribute));

				if (tfResult.numPrimitives != 2*primitiveCounts[tessLevelCaseNdx][subTessLevelCaseNdx])
				{
					log << TestLog::Message << "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be "
											<< tfResult.numPrimitives << ", reference value is " << 2*primitiveCounts[tessLevelCaseNdx][subTessLevelCaseNdx]
											<< TestLog::EndMessage;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of primitives");
					return STOP;
				}

				{
					const int			half			= (int)tfResult.varying.size()/2;
					const vector<Vec3>	prim0Vertices	= vector<Vec3>(tfResult.varying.begin(), tfResult.varying.begin() + half);
					const Vec3* const	prim1Vertices	= &tfResult.varying[half];

					for (int vtxNdx = 0; vtxNdx < (int)prim0Vertices.size(); vtxNdx++)
					{
						if (prim0Vertices[vtxNdx] != prim1Vertices[vtxNdx])
						{
							log << TestLog::Message << "Failure: tessellation coordinate at index " << vtxNdx << " differs between two primitives drawn in one draw call" << TestLog::EndMessage
								<< TestLog::Message << "Note: the coordinate is " << prim0Vertices[vtxNdx] << " for the first primitive and " << prim1Vertices[vtxNdx] << " for the second" << TestLog::EndMessage
								<< TestLog::Message << "Note: tessellation levels for both primitives were: " << tessellationLevelsString(&inner[0], &outer[0]) << TestLog::EndMessage;
							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of primitives");
							return STOP;
						}
					}

					if (programNdx == 0 && subTessLevelCaseNdx == 0)
						firstPrimVertices = prim0Vertices;
					else
					{
						const bool compareOk = compare(firstPrimVertices, prim0Vertices, levelCase.mem);
						if (!compareOk)
						{
							log << TestLog::Message << "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
													<< "  - case A: program 0, tessellation levels: " << tessLevelCases[tessLevelCaseNdx].levels[0].description() << "\n"
													<< "  - case B: program " << programNdx << ", tessellation levels: " << tessLevels.description() << TestLog::EndMessage;
							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of primitives");
							return STOP;
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}